

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QColorListView.cpp
# Opt level: O0

void __thiscall
QColorListView::setSelectedColorNames(QColorListView *this,QStringList *colorListNames)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  long in_RDI;
  QString colorName_1;
  QModelIndex index;
  int i;
  QString *colorName;
  QForeachContainer<QList<QString>_> _container_82;
  QItemSelection selection;
  QSet<QString> colors;
  QString *in_stack_fffffffffffffe58;
  QColor *in_stack_fffffffffffffe60;
  undefined7 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6f;
  QSet<QString> *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  int iVar4;
  QFlags<QItemSelectionModel::SelectionFlag> local_134;
  QVariant local_130;
  QModelIndex local_f8;
  undefined1 local_e0 [24];
  QModelIndex local_c8;
  int local_ac;
  QString *local_80;
  QString *local_78;
  const_iterator local_48;
  const_iterator local_40;
  undefined1 local_30 [48];
  
  QSet<QString>::QSet((QSet<QString> *)0x218131);
  QItemSelection::QItemSelection((QItemSelection *)0x21813e);
  QtPrivate::qMakeForeachContainer<QList<QString>const&>
            ((QList<QString> *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
  while( true ) {
    local_78 = local_40.i;
    bVar1 = QList<QString>::const_iterator::operator!=(&local_48,local_40);
    if (!bVar1) break;
    local_80 = QList<QString>::const_iterator::operator*(&local_48);
    QColor::QColor(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    QColorListViewPrivate::internalColorName
              ((QColorListViewPrivate *)
               CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
               in_stack_fffffffffffffe60);
    QSet<QString>::operator<<
              (in_stack_fffffffffffffe70,
               (QString *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
    QString::~QString((QString *)0x218256);
    QList<QString>::const_iterator::operator++(&local_48);
  }
  QtPrivate::QForeachContainer<QList<QString>_>::~QForeachContainer
            ((QForeachContainer<QList<QString>_> *)0x218199);
  local_ac = 0;
  while( true ) {
    iVar4 = local_ac;
    plVar3 = *(long **)(*(long *)(in_RDI + 0x28) + 0x18);
    QModelIndex::QModelIndex(&local_c8);
    iVar2 = (**(code **)(*plVar3 + 0x78))(plVar3,&local_c8);
    if (iVar2 <= iVar4) break;
    plVar3 = *(long **)(*(long *)(in_RDI + 0x28) + 0x18);
    iVar4 = local_ac;
    QModelIndex::QModelIndex(&local_f8);
    (**(code **)(*plVar3 + 0x60))(local_e0,plVar3,iVar4,0,&local_f8);
    QModelIndex::data((QModelIndex *)CONCAT44(iVar4,in_stack_fffffffffffffe78),
                      (int)((ulong)plVar3 >> 0x20));
    QVariant::toString();
    QVariant::~QVariant(&local_130);
    bVar1 = QSet<QString>::contains
                      ((QSet<QString> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    if (bVar1) {
      QItemSelection::select((QModelIndex *)local_30,(QModelIndex *)local_e0);
    }
    QString::~QString((QString *)0x218420);
    local_ac = local_ac + 1;
  }
  plVar3 = (long *)QAbstractItemView::selectionModel();
  QFlags<QItemSelectionModel::SelectionFlag>::QFlags(&local_134,ClearAndSelect);
  (**(code **)(*plVar3 + 0x70))(plVar3,local_30,local_134.i);
  QItemSelection::~QItemSelection((QItemSelection *)0x21847f);
  QSet<QString>::~QSet((QSet<QString> *)0x21848c);
  return;
}

Assistant:

void QColorListView::setSelectedColorNames(const QStringList &colorListNames) {
    QSet<QString> colors;
    QItemSelection selection;

    foreach (const QString &colorName, colorListNames) {
        colors << d->internalColorName(QColor(colorName));
    }

    for (int i = 0; i < d->model->rowCount(); i++) {
        const QModelIndex index = d->model->index(i, 0);
        const QString colorName = index.data(static_cast<int>(QColorListModel::Role::HexArgbName)).toString();

        if (colors.contains(colorName)) {
            selection.select(index, index);
        }
    }

    selectionModel()->select(selection, QItemSelectionModel::ClearAndSelect);
}